

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *type_info,
                 type_info *type_info_backup,_func_void_ptr_void_ptr *copy_constructor,
                 _func_void_ptr_void_ptr *move_constructor,void *existing_holder)

{
  byte bVar1;
  type_info *ptVar2;
  PyObject *pPVar3;
  byte bVar4;
  internals *this;
  _Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> _Var5;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> _Var6;
  type_info *ptVar7;
  handle hVar8;
  void *pvVar9;
  runtime_error *this_00;
  object *this_01;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>_>
  pVar10;
  void *src;
  string msg;
  void *local_88;
  object local_80;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  PyObject *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = _src;
  if (_src == (void *)0x0) {
    hVar8.m_ptr = (PyObject *)&_Py_NoneStruct;
    this_01 = (object *)&local_78;
    local_78._M_p = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 2;
    goto LAB_00140b2f;
  }
  local_58 = parent.m_ptr;
  this = get_internals();
  local_78._M_p = (pointer)type_info;
  _Var5._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,(key_type *)&local_78);
  if ((_Var5._M_cur == (__node_type *)0x0) &&
     (local_78._M_p = (pointer)type_info_backup,
     _Var5._M_cur = (__node_type *)
                    std::
                    _Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)this,(key_type *)&local_78), _Var5._M_cur == (__node_type *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               *(char **)(type_info_backup + 8) + (**(char **)(type_info_backup + 8) == '*'),
               (allocator<char> *)&local_50);
    clean_type_id((string *)&local_78);
    std::operator+(&local_50,"Unregistered type : ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
    PyErr_SetString(_PyExc_TypeError,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_78._M_p != (string *)&local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    return (handle)(PyObject *)0x0;
  }
  ptVar2 = *(type_info **)
            ((long)&((_Var5._M_cur)->
                    super__Hash_node_value<std::pair<const_std::type_index,_void_*>,_false>).
                    super__Hash_node_value_base<std::pair<const_std::type_index,_void_*>_>.
                    _M_storage._M_storage + 8);
  pVar10 = std::
           _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range(&(this->registered_instances)._M_h,&local_88);
  for (_Var6._M_cur = (__node_type *)
                      pVar10.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur;
      (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)_Var6._M_cur !=
      pVar10.second.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur.
      super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>;
      _Var6._M_cur = (__node_type *)((_Var6._M_cur)->super__Hash_node_base)._M_nxt) {
    ptVar7 = get_type_info(*(PyTypeObject **)
                            (*(long *)((long)&((_Var6._M_cur)->
                                              super__Hash_node_value<std::pair<const_void_*const,_void_*>,_false>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_void_*const,_void_*>_>
                                              ._M_storage._M_storage + 8) + 8));
    if ((ptVar7 != (type_info *)0x0) && (ptVar7 == ptVar2)) {
      pPVar3 = *(PyObject **)
                ((long)&((_Var6._M_cur)->
                        super__Hash_node_value<std::pair<const_void_*const,_void_*>,_false>).
                        super__Hash_node_value_base<std::pair<const_void_*const,_void_*>_>.
                        _M_storage._M_storage + 8);
      if (pPVar3 == (PyObject *)0x0) {
        return (handle)(PyObject *)0x0;
      }
      pPVar3->ob_refcnt = pPVar3->ob_refcnt + 1;
      return (handle)pPVar3;
    }
  }
  hVar8.m_ptr = (PyObject *)PyType_GenericAlloc(ptVar2->type,0);
  hVar8.m_ptr[1].ob_refcnt = 0;
  bVar1 = (byte)hVar8.m_ptr[2].ob_refcnt;
  bVar4 = bVar1 & 0xfe;
  *(byte *)&hVar8.m_ptr[2].ob_refcnt = bVar4;
  local_80.super_handle.m_ptr = (handle)(handle)hVar8.m_ptr;
  switch(policy) {
  case automatic:
  case take_ownership:
    hVar8.m_ptr[1].ob_refcnt = (Py_ssize_t)local_88;
    *(byte *)&hVar8.m_ptr[2].ob_refcnt = bVar1 | 1;
    break;
  case automatic_reference:
  case reference:
    hVar8.m_ptr[1].ob_refcnt = (Py_ssize_t)local_88;
    *(byte *)&hVar8.m_ptr[2].ob_refcnt = bVar4;
    break;
  case copy:
    if (copy_constructor == (_func_void_ptr_void_ptr *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"return_value_policy = copy, but the object is non-copyable!");
      goto LAB_00140baa;
    }
    pvVar9 = (*copy_constructor)(local_88);
    goto LAB_00140af0;
  case move:
    if ((move_constructor == (_func_void_ptr_void_ptr *)0x0) &&
       (move_constructor = copy_constructor, copy_constructor == (_func_void_ptr_void_ptr *)0x0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "return_value_policy = move, but the object is neither movable nor copyable!");
      goto LAB_00140baa;
    }
    pvVar9 = (*move_constructor)(local_88);
LAB_00140af0:
    hVar8.m_ptr[1].ob_refcnt = (Py_ssize_t)pvVar9;
    *(byte *)&hVar8.m_ptr[2].ob_refcnt = (byte)hVar8.m_ptr[2].ob_refcnt | 1;
    break;
  case reference_internal:
    hVar8.m_ptr[1].ob_refcnt = (Py_ssize_t)local_88;
    *(byte *)&hVar8.m_ptr[2].ob_refcnt = bVar4;
    if (local_58 == (PyObject *)0x0) {
      pybind11_fail("Could not activate keep_alive!");
    }
    if ((local_58 != (PyObject *)&_Py_NoneStruct) && (hVar8.m_ptr != (PyObject *)&_Py_NoneStruct)) {
      local_50._M_dataplus._M_p = (pointer)local_58;
      cpp_function::
      cpp_function<pybind11::detail::keep_alive_impl(pybind11::handle,pybind11::handle)::_lambda(pybind11::handle)_1_,,void(pybind11::handle)>
                ((cpp_function *)&local_78,(type *)&local_50);
      weakref::weakref((weakref *)&local_50,hVar8,(handle)local_78._M_p);
      local_58->ob_refcnt = local_58->ob_refcnt + 1;
      local_50._M_dataplus._M_p = (pointer)0x0;
      object::~object((object *)&local_50);
      object::~object((object *)&local_78);
    }
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unhandled return_value_policy: should not happen!");
LAB_00140baa:
    *(undefined ***)this_00 = &PTR__runtime_error_00153890;
    __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (*ptVar2->init_holder)((PyObject *)local_80.super_handle.m_ptr,existing_holder);
  std::
  _Hashtable<void_const*,std::pair<void_const*const,void*>,std::allocator<std::pair<void_const*const,void*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<void*&,_object*&>
            ((_Hashtable<void_const*,std::pair<void_const*const,void*>,std::allocator<std::pair<void_const*const,void*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&this->registered_instances,0,hVar8.m_ptr + 1,&local_80);
  hVar8 = local_80.super_handle.m_ptr;
  this_01 = &local_80;
  local_80.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_00140b2f:
  object::~object(this_01);
  return (handle)hVar8.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const std::type_info *type_info,
                                         const std::type_info *type_info_backup,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().inc_ref();

        auto &internals = get_internals();

        auto it = internals.registered_types_cpp.find(std::type_index(*type_info));
        if (it == internals.registered_types_cpp.end()) {
            type_info = type_info_backup;
            it = internals.registered_types_cpp.find(std::type_index(*type_info));
        }

        if (it == internals.registered_types_cpp.end()) {
            std::string tname = type_info->name();
            detail::clean_type_id(tname);
            std::string msg = "Unregistered type : " + tname;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return handle();
        }

        auto tinfo = (const detail::type_info *) it->second;

        auto it_instances = internals.registered_instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            auto instance_type = detail::get_type_info(Py_TYPE(it_i->second));
            if (instance_type && instance_type == tinfo)
                return handle((PyObject *) it_i->second).inc_ref();
        }

        auto inst = reinterpret_steal<object>(PyType_GenericAlloc(tinfo->type, 0));

        auto wrapper = (instance<void> *) inst.ptr();

        wrapper->value = nullptr;
        wrapper->owned = false;

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                wrapper->value = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                wrapper->value = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    wrapper->value = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = copy, but the "
                                     "object is non-copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    wrapper->value = move_constructor(src);
                else if (copy_constructor)
                    wrapper->value = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = move, but the "
                                     "object is neither movable nor copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                wrapper->value = src;
                wrapper->owned = false;
                detail::keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_holder(inst.ptr(), existing_holder);

        internals.registered_instances.emplace(wrapper->value, inst.ptr());

        return inst.release();
    }